

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O3

uint lodepng_chunk_append(uchar **out,size_t *outlength,uchar *chunk)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  ulong uVar5;
  uchar *puVar6;
  uint uVar7;
  uint uVar8;
  size_t __size;
  
  bVar1 = *chunk;
  bVar2 = chunk[1];
  bVar3 = chunk[2];
  bVar4 = chunk[3];
  uVar7 = 0x4d;
  uVar8 = bVar4 + 0xc + ((uint)bVar2 * 0x10000 + (uint)bVar1 * 0x1000000 | (uint)bVar3 << 8);
  uVar5 = *outlength;
  __size = uVar8 + uVar5;
  if (!CARRY8((ulong)uVar8,uVar5)) {
    puVar6 = (uchar *)realloc(*out,__size);
    if (puVar6 == (uchar *)0x0) {
      uVar7 = 0x53;
    }
    else {
      uVar7 = 0;
      *out = puVar6;
      *outlength = __size;
      if (uVar8 != 0) {
        memcpy(puVar6 + uVar5,chunk,
               (ulong)(bVar4 + 0xb +
                      ((uint)bVar1 * 0x1000000 | (uint)bVar2 * 0x10000 | (uint)bVar3 << 8)) + 1);
        uVar7 = 0;
      }
    }
  }
  return uVar7;
}

Assistant:

unsigned lodepng_chunk_append(unsigned char** out, size_t* outlength, const unsigned char* chunk)
{
  unsigned i;
  unsigned total_chunk_length = lodepng_chunk_length(chunk) + 12;
  unsigned char *chunk_start, *new_buffer;
  size_t new_length = (*outlength) + total_chunk_length;
  if(new_length < total_chunk_length || new_length < (*outlength)) return 77; /*integer overflow happened*/

  new_buffer = (unsigned char*)lodepng_realloc(*out, new_length);
  if(!new_buffer) return 83; /*alloc fail*/
  (*out) = new_buffer;
  (*outlength) = new_length;
  chunk_start = &(*out)[new_length - total_chunk_length];

  for(i = 0; i != total_chunk_length; ++i) chunk_start[i] = chunk[i];

  return 0;
}